

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,StringRef text,XmlFormatting fmt)

{
  bool bVar1;
  ostream *poVar2;
  undefined4 in_register_0000000c;
  size_type sVar3;
  StringRef str;
  XmlFormatting fmt_local;
  XmlWriter *this_local;
  StringRef text_local;
  
  sVar3 = CONCAT44(in_register_0000000c,fmt);
  str.m_start = (char *)text.m_size;
  ensureTagClosed(this);
  bVar1 = anon_unknown_26::shouldIndent(fmt);
  if (bVar1) {
    std::operator<<(this->m_os,(string *)&this->m_indent);
  }
  poVar2 = std::operator<<(this->m_os,"<!-- ");
  str.m_size = sVar3;
  poVar2 = Catch::operator<<((Catch *)poVar2,(ostream *)text.m_start,str);
  std::operator<<(poVar2," -->");
  applyFormatting(this,fmt);
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeComment( StringRef text, XmlFormatting fmt ) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!-- " << text << " -->";
        applyFormatting(fmt);
        return *this;
    }